

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O0

void checkARCAccessorsSlow(Class cls)

{
  SEL expected;
  bool bVar1;
  BOOL BVar2;
  objc_method *poVar3;
  SEL s;
  objc_method_list *poStack_20;
  int i;
  objc_method_list *l;
  BOOL selfImplementsRetainRelease;
  BOOL superIsFast;
  Class cls_local;
  
  if ((dtable_t)cls->dtable == uninstalled_dtable) {
    if (checkARCAccessorsSlow::retain == (SEL)0x0) {
      checkARCAccessorsSlow::retain = sel_registerName("retain");
      checkARCAccessorsSlow::release = sel_registerName("release");
      checkARCAccessorsSlow::autorelease = sel_registerName("autorelease");
      checkARCAccessorsSlow::isARC = sel_registerName("_ARCCompliantRetainRelease");
    }
    l._7_1_ = '\x01';
    if (cls->super_class != (Class)0x0) {
      checkARCAccessorsSlow(cls->super_class);
      l._7_1_ = objc_test_class_flag(cls->super_class,objc_class_flag_fast_arc);
    }
    bVar1 = false;
    for (poStack_20 = cls->methods; poStack_20 != (objc_method_list *)0x0;
        poStack_20 = poStack_20->next) {
      for (s._4_4_ = 0; s._4_4_ < poStack_20->count; s._4_4_ = s._4_4_ + 1) {
        poVar3 = method_at_index(poStack_20,s._4_4_);
        expected = poVar3->selector;
        BVar2 = selEqualUnTyped(expected,checkARCAccessorsSlow::retain);
        if (((BVar2 == '\0') &&
            (BVar2 = selEqualUnTyped(expected,checkARCAccessorsSlow::release), BVar2 == '\0')) &&
           (BVar2 = selEqualUnTyped(expected,checkARCAccessorsSlow::autorelease), BVar2 == '\0')) {
          BVar2 = selEqualUnTyped(expected,checkARCAccessorsSlow::isARC);
          if (BVar2 != '\0') {
            objc_set_class_flag(cls,objc_class_flag_fast_arc);
            return;
          }
        }
        else {
          bVar1 = true;
        }
      }
    }
    if ((l._7_1_ != '\0') && (!bVar1)) {
      objc_set_class_flag(cls,objc_class_flag_fast_arc);
    }
  }
  return;
}

Assistant:

PRIVATE void checkARCAccessorsSlow(Class cls)
{
	if (cls->dtable != uninstalled_dtable)
	{
		return;
	}
	static SEL retain, release, autorelease, isARC;
	if (NULL == retain)
	{
		retain = sel_registerName("retain");
		release = sel_registerName("release");
		autorelease = sel_registerName("autorelease");
		isARC = sel_registerName("_ARCCompliantRetainRelease");
	}
	BOOL superIsFast = YES;
	if (cls->super_class != Nil)
	{
		checkARCAccessorsSlow(cls->super_class);
		superIsFast = objc_test_class_flag(cls->super_class, objc_class_flag_fast_arc);
	}
	BOOL selfImplementsRetainRelease = NO;
	for (struct objc_method_list *l=cls->methods ; l != NULL ; l= l->next)
	{
		for (int i=0 ; i<l->count ; i++)
		{
			SEL s = method_at_index(l, i)->selector;
			if (selEqualUnTyped(s, retain) ||
			    selEqualUnTyped(s, release) ||
			    selEqualUnTyped(s, autorelease))
			{
				selfImplementsRetainRelease = YES;
			}
			else if (selEqualUnTyped(s, isARC))
			{
				objc_set_class_flag(cls, objc_class_flag_fast_arc);
				return;
			}
		}
	}
	if (superIsFast && !selfImplementsRetainRelease)
	{
		objc_set_class_flag(cls, objc_class_flag_fast_arc);
	}
}